

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

Binary * __thiscall i2p::sam::Session::MyDestination(Session *this)

{
  uint16_t uVar1;
  size_type sVar2;
  runtime_error *prVar3;
  const_iterator __first;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  char *in_RSI;
  Binary *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long in_FS_OFFSET;
  size_t dest_len;
  uint16_t cert_len;
  undefined6 in_stack_ffffffffffffff08;
  uint16_t in_stack_ffffffffffffff0e;
  size_type in_stack_ffffffffffffff10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff18;
  allocator_type *in_stack_ffffffffffffff30;
  Binary *args;
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = in_RDI;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT26(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08));
  if (sVar2 < 0x183) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT26(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08));
    tinyformat::format<unsigned_long,unsigned_long>
              (in_RSI,(unsigned_long *)args,(unsigned_long *)in_RDI);
    std::runtime_error::runtime_error(prVar3,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    uVar1 = be16toh_internal(in_stack_ffffffffffffff0e);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT26(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08));
    if (sVar2 < (ulong)uVar1 + 0x183) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT26(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08));
      tinyformat::format<unsigned_short,unsigned_long,unsigned_long>
                (in_RSI,(unsigned_short *)args,(unsigned_long *)in_RDI,
                 (unsigned_long *)in_stack_ffffffffffffff30);
      std::runtime_error::runtime_error(prVar3,local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 0xa8);
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
      __last = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_ffffffffffffff18,(difference_type)this_00);
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)
                 CONCAT26(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08));
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (in_RDI,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )__first._M_current,__last,in_stack_ffffffffffffff30);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 CONCAT26(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return args;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Binary Session::MyDestination() const
{
    // From https://geti2p.net/spec/common-structures#destination:
    // "They are 387 bytes plus the certificate length specified at bytes 385-386, which may be
    // non-zero"
    static constexpr size_t DEST_LEN_BASE = 387;
    static constexpr size_t CERT_LEN_POS = 385;

    uint16_t cert_len;

    if (m_private_key.size() < CERT_LEN_POS + sizeof(cert_len)) {
        throw std::runtime_error(strprintf("The private key is too short (%d < %d)",
                                           m_private_key.size(),
                                           CERT_LEN_POS + sizeof(cert_len)));
    }

    memcpy(&cert_len, &m_private_key.at(CERT_LEN_POS), sizeof(cert_len));
    cert_len = be16toh_internal(cert_len);

    const size_t dest_len = DEST_LEN_BASE + cert_len;

    if (dest_len > m_private_key.size()) {
        throw std::runtime_error(strprintf("Certificate length (%d) designates that the private key should "
                                           "be %d bytes, but it is only %d bytes",
                                           cert_len,
                                           dest_len,
                                           m_private_key.size()));
    }

    return Binary{m_private_key.begin(), m_private_key.begin() + dest_len};
}